

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

void boost::detail::(anonymous_namespace)::tls_destructor(void *data)

{
  thread_exit_callback_node *ptVar1;
  thread_exit_callback_node *ptVar2;
  iterator __position;
  type ptVar3;
  type ptVar4;
  thread_data_ptr thread_info;
  
  enable_shared_from_this<boost::detail::thread_data_base>::shared_from_this
            ((enable_shared_from_this<boost::detail::thread_data_base> *)&thread_info);
  if (thread_info.px != (element_type *)0x0) {
    while ((ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->(&thread_info),
           (ptVar3->tss_data)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
           (ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->(&thread_info),
           ptVar3->thread_exit_callbacks != (thread_exit_callback_node *)0x0))) {
      while (ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->(&thread_info),
            ptVar3->thread_exit_callbacks != (thread_exit_callback_node *)0x0) {
        ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->(&thread_info);
        ptVar1 = ptVar3->thread_exit_callbacks;
        ptVar2 = ptVar1->next;
        ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->(&thread_info);
        ptVar3->thread_exit_callbacks = ptVar2;
        if (ptVar1->func != (thread_exit_function_base *)0x0) {
          (**(code **)(*(long *)ptVar1->func + 0x10))();
          if (ptVar1->func != (thread_exit_function_base *)0x0) {
            (**(code **)(*(long *)ptVar1->func + 8))();
          }
        }
        operator_delete(ptVar1,0x10);
      }
      while (ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->(&thread_info),
            (ptVar3->tss_data)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->(&thread_info);
        __position._M_node = (ptVar3->tss_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ;
        if ((__position._M_node[1]._M_parent != (_Base_ptr)0x0) &&
           (__position._M_node[1]._M_right != (_Base_ptr)0x0)) {
          ptVar4 = shared_ptr<boost::detail::tss_cleanup_function>::operator*
                             ((shared_ptr<boost::detail::tss_cleanup_function> *)
                              &__position._M_node[1]._M_parent);
          (**(code **)(*(long *)ptVar4 + 0x10))(ptVar4,__position._M_node[1]._M_right);
        }
        ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->(&thread_info);
        std::
        _Rb_tree<void_const*,std::pair<void_const*const,boost::detail::tss_data_node>,std::_Select1st<std::pair<void_const*const,boost::detail::tss_data_node>>,std::less<void_const*>,std::allocator<std::pair<void_const*const,boost::detail::tss_data_node>>>
        ::erase_abi_cxx11_((_Rb_tree<void_const*,std::pair<void_const*const,boost::detail::tss_data_node>,std::_Select1st<std::pair<void_const*const,boost::detail::tss_data_node>>,std::less<void_const*>,std::allocator<std::pair<void_const*const,boost::detail::tss_data_node>>>
                            *)&ptVar3->tss_data,__position);
      }
    }
    ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->(&thread_info);
    shared_ptr<boost::detail::thread_data_base>::reset(&ptVar3->self);
  }
  shared_count::~shared_count(&thread_info.pn);
  return;
}

Assistant:

static void tls_destructor(void* data)
                {
                    //boost::detail::thread_data_base* thread_info=static_cast<boost::detail::thread_data_base*>(data);
                    boost::detail::thread_data_ptr thread_info = static_cast<boost::detail::thread_data_base*>(data)->shared_from_this();

                    if(thread_info)
                    {
                        while(!thread_info->tss_data.empty() || thread_info->thread_exit_callbacks)
                        {

                            while(thread_info->thread_exit_callbacks)
                            {
                                detail::thread_exit_callback_node* const current_node=thread_info->thread_exit_callbacks;
                                thread_info->thread_exit_callbacks=current_node->next;
                                if(current_node->func)
                                {
                                    (*current_node->func)();
                                    delete current_node->func;
                                }
                                delete current_node;
                            }
                            while (!thread_info->tss_data.empty())
                            {
                                std::map<void const*,detail::tss_data_node>::iterator current
                                    = thread_info->tss_data.begin();
                                if(current->second.func && (current->second.value!=0))
                                {
                                    (*current->second.func)(current->second.value);
                                }
                                thread_info->tss_data.erase(current);
                            }
                        }
                        thread_info->self.reset();
                    }
                }